

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_data.hpp
# Opt level: O0

void duckdb::ArrowEnumData<signed_char>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *this;
  data_ptr_t pdVar1;
  ArrowArray *__src;
  long in_RDX;
  long in_RDI;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  *in_stack_00000068;
  LogicalType *in_stack_00000070;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  *in_stack_ffffffffffffff98;
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
  *in_stack_ffffffffffffffa0;
  LogicalTypeId in_stack_ffffffffffffffbf;
  LogicalType *in_stack_ffffffffffffffc0;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  local_38 [4];
  long local_18;
  long local_8;
  
  *(undefined8 *)(in_RDX + 0x18) = 2;
  local_18 = in_RDX;
  local_8 = in_RDI;
  this = ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x153944a);
  pdVar1 = ArrowBuffer::data(this);
  *(data_ptr_t *)(*(long *)(local_18 + 0x28) + 8) = pdVar1;
  *(long *)(local_18 + 0x38) = local_8 + 0xa8;
  LogicalType::LogicalType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
  ::operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
  unique_ptr(local_38,in_stack_ffffffffffffff98);
  __src = ArrowAppender::FinalizeChild(in_stack_00000070,in_stack_00000068);
  memcpy((void *)(local_8 + 0xa8),__src,0x50);
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
               *)0x15394ee);
  LogicalType::~LogicalType((LogicalType *)0x15394f8);
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 2;
		result->buffers[1] = append_data.GetMainBuffer().data();
		// finalize the enum child data, and assign it to the dictionary
		result->dictionary = &append_data.dictionary;
		append_data.dictionary =
		    *ArrowAppender::FinalizeChild(LogicalType::VARCHAR, std::move(append_data.child_data[0]));
	}